

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void duckdb_je_arena_postfork_parent(tsdn_t *tsdn,arena_t *arena)

{
  tsdn_t *in_RDI;
  bin_t *bin;
  uint j;
  szind_t i;
  pa_shard_t *in_stack_ffffffffffffffc8;
  tsdn_t *in_stack_ffffffffffffffd0;
  arena_t *in_stack_ffffffffffffffd8;
  arena_t *in_stack_ffffffffffffffe0;
  uint local_18;
  uint local_14;
  
  for (local_14 = 0; local_14 < 0x24; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < duckdb_je_bin_infos[local_14].n_shards; local_18 = local_18 + 1) {
      in_stack_ffffffffffffffd8 =
           (arena_t *)
           arena_get_bin(in_stack_ffffffffffffffe0,
                         (szind_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                         (uint)in_stack_ffffffffffffffd8);
      in_stack_ffffffffffffffd0 = in_RDI;
      in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffd8;
      arena_bin_has_batch(local_14);
      duckdb_je_bin_postfork_parent
                ((tsdn_t *)in_stack_ffffffffffffffe0,(bin_t *)in_stack_ffffffffffffffd8,
                 SUB81((ulong)in_stack_ffffffffffffffd0 >> 0x38,0));
    }
  }
  duckdb_je_malloc_mutex_postfork_parent
            (in_stack_ffffffffffffffd0,(malloc_mutex_t *)in_stack_ffffffffffffffc8);
  duckdb_je_base_postfork_parent(in_stack_ffffffffffffffd0,(base_t *)in_stack_ffffffffffffffc8);
  duckdb_je_pa_shard_postfork_parent(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  duckdb_je_malloc_mutex_postfork_parent
            (in_stack_ffffffffffffffd0,(malloc_mutex_t *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void
arena_postfork_parent(tsdn_t *tsdn, arena_t *arena) {
	for (szind_t i = 0; i < SC_NBINS; i++) {
		for (unsigned j = 0; j < bin_infos[i].n_shards; j++) {
			bin_t *bin = arena_get_bin(arena, i, j);
			bin_postfork_parent(tsdn, bin, arena_bin_has_batch(i));
		}
	}

	malloc_mutex_postfork_parent(tsdn, &arena->large_mtx);
	base_postfork_parent(tsdn, arena->base);
	pa_shard_postfork_parent(tsdn, &arena->pa_shard);
	if (config_stats) {
		malloc_mutex_postfork_parent(tsdn, &arena->tcache_ql_mtx);
	}
}